

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall
randomx::JitCompilerX86::genAddressReg(JitCompilerX86 *this,Instruction *instr,bool rax)

{
  uint32_t uVar1;
  int iVar2;
  char cVar3;
  byte in_DL;
  Instruction *in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [2];
  
  emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
  cVar3 = '\b';
  if ((in_DL & 1) != 0) {
    cVar3 = '\0';
  }
  emitByte(in_RDI,in_RSI->src + 0x80 + cVar3);
  if (in_RSI->src == '\x04') {
    emitByte(in_RDI,'$');
  }
  uVar1 = Instruction::getImm32((Instruction *)0x151da3);
  emit32(in_RDI,uVar1);
  if ((in_DL & 1) == 0) {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    emitByte(in_RDI,'%');
  }
  iVar2 = Instruction::getModMem(in_RSI);
  uVar1 = 0x3fff8;
  if (iVar2 != 0) {
    uVar1 = 0x3ff8;
  }
  emit32(in_RDI,uVar1);
  return;
}

Assistant:

void JitCompilerX86::genAddressReg(Instruction& instr, bool rax = true) {
		emit(LEA_32);
		emitByte(0x80 + instr.src + (rax ? 0 : 8));
		if (instr.src == RegisterNeedsSib) {
			emitByte(0x24);
		}
		emit32(instr.getImm32());
		if (rax)
			emitByte(AND_EAX_I);
		else
			emit(AND_ECX_I);
		emit32(instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
	}